

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O1

QAMSet * __thiscall
OSTEI_HRR_Algorithm_Base::GetIntermediates
          (QAMSet *__return_storage_ptr__,OSTEI_HRR_Algorithm_Base *this)

{
  _Rb_tree_header *p_Var1;
  pointer pQVar2;
  bool bVar3;
  const_iterator cVar4;
  QAM *it;
  pointer __k;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  __k = (this->amorder_).super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
        super__Vector_impl_data._M_start;
  pQVar2 = (this->amorder_).super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__k != pQVar2) {
    do {
      cVar4 = std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::
              find(&(this->topqam_)._M_t,__k);
      if ((_Rb_tree_header *)cVar4._M_node == &(this->topqam_)._M_t._M_impl.super__Rb_tree_header) {
        if ((this->info_).super_GeneratorInfoBase.deriv_ < 1) {
          bVar3 = QAM::operator==(__k,&(this->info_).super_GeneratorInfoBase.finalam_);
          if (bVar3) goto LAB_00115521;
        }
        std::_Rb_tree<QAM,QAM,std::_Identity<QAM>,std::less<QAM>,std::allocator<QAM>>::
        _M_insert_unique<QAM_const&>
                  ((_Rb_tree<QAM,QAM,std::_Identity<QAM>,std::less<QAM>,std::allocator<QAM>> *)
                   __return_storage_ptr__,__k);
      }
LAB_00115521:
      __k = __k + 1;
    } while (__k != pQVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

QAMSet OSTEI_HRR_Algorithm_Base::GetIntermediates(void) const
{
    QAMSet ret;
    for(const auto & it : amorder_)
    {
        if(!topqam_.count(it) && (info_.Deriv() > 0 || !info_.IsFinalAM(it)))
            ret.insert(it);
    }

    return ret;
}